

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dumpmode.c
# Opt level: O2

int DumpModeEncode(TIFF *tif,uint8_t *pp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint8_t *d;
  long c;
  
  while( true ) {
    if (cc < 1) {
      return 1;
    }
    lVar2 = tif->tif_rawdatasize;
    lVar3 = tif->tif_rawcc;
    c = lVar2 - lVar3;
    if (lVar3 + cc <= lVar2) {
      c = cc;
    }
    if (c < 1) break;
    d = tif->tif_rawcp;
    if (d != pp) {
      _TIFFmemcpy(d,pp,c);
      lVar2 = tif->tif_rawdatasize;
      d = tif->tif_rawcp;
      lVar3 = tif->tif_rawcc;
    }
    tif->tif_rawcp = d + c;
    tif->tif_rawcc = lVar3 + c;
    pp = pp + c;
    cc = cc - c;
    if ((lVar2 <= lVar3 + c) && (iVar1 = TIFFFlushData1(tif), iVar1 == 0)) {
      return 0;
    }
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dumpmode.c"
                ,0x34,"int DumpModeEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int DumpModeEncode(TIFF *tif, uint8_t *pp, tmsize_t cc, uint16_t s)
{
    (void)s;
    while (cc > 0)
    {
        tmsize_t n;

        n = cc;
        if (tif->tif_rawcc + n > tif->tif_rawdatasize)
            n = tif->tif_rawdatasize - tif->tif_rawcc;

        assert(n > 0);

        /*
         * Avoid copy if client has setup raw
         * data buffer to avoid extra copy.
         */
        if (tif->tif_rawcp != pp)
            _TIFFmemcpy(tif->tif_rawcp, pp, n);
        tif->tif_rawcp += n;
        tif->tif_rawcc += n;
        pp += n;
        cc -= n;
        if (tif->tif_rawcc >= tif->tif_rawdatasize && !TIFFFlushData1(tif))
            return (0);
    }
    return (1);
}